

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalCSE.cpp
# Opt level: O0

Pass * wasm::createLocalCSEPass(void)

{
  Pass *this;
  
  this = (Pass *)operator_new(0x108);
  memset(this,0,0x108);
  LocalCSE::LocalCSE((LocalCSE *)this);
  return this;
}

Assistant:

Pass* createLocalCSEPass() { return new LocalCSE(); }